

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O0

void deqp::gles31::Functional::anon_unknown_0::renderTexture3DView
               (TestContext *testContext,RenderContext *renderContext,TextureRenderer *renderer,
               ResultCollector *results,Random *rng,deUint32 name,ImageInfo *info,
               Texture3DView *refTexture,Verify verify)

{
  int iVar1;
  deUint32 dVar2;
  TestLog *log_00;
  undefined4 extraout_var;
  ConstPixelBufferAccess *this;
  TextureFormat *pTVar4;
  Vector<float,_4> local_1c8;
  Sampler local_1b8;
  float local_170 [2];
  ImageInfo local_168;
  undefined1 local_154 [8];
  TextureImageIterator imageIterator;
  ReferenceParams renderParams;
  TextureFormatInfo spec;
  TextureFormat format;
  Functions *gl;
  TestLog *log;
  deUint32 name_local;
  Random *rng_local;
  ResultCollector *results_local;
  TextureRenderer *renderer_local;
  RenderContext *renderContext_local;
  TestContext *testContext_local;
  long lVar3;
  
  log_00 = tcu::TestContext::getLog(testContext);
  iVar1 = (*renderContext->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  this = tcu::Texture3DView::getLevel(refTexture,0);
  pTVar4 = tcu::ConstPixelBufferAccess::getFormat(this);
  spec.lookupBias.m_data._8_8_ = *pTVar4;
  tcu::getTextureFormatInfo
            ((TextureFormatInfo *)&renderParams.baseLevel,
             (TextureFormat *)(spec.lookupBias.m_data + 2));
  glu::TextureTestUtil::ReferenceParams::ReferenceParams
            ((ReferenceParams *)&imageIterator.m_currentImage,TEXTURETYPE_3D);
  ImageInfo::ImageInfo(&local_168,info);
  iVar1 = getLevelCount(info);
  TextureImageIterator::TextureImageIterator((TextureImageIterator *)local_154,&local_168,iVar1);
  local_170[0] = spec.lookupBias.m_data[2];
  local_170[1] = spec.lookupBias.m_data[3];
  imageIterator.m_levelCount =
       glu::TextureTestUtil::getSamplerType((TextureFormat)spec.lookupBias.m_data._8_8_);
  tcu::Vector<float,_4>::Vector(&local_1c8,0.0,0.0,0.0,0.0);
  tcu::Sampler::Sampler
            (&local_1b8,CLAMP_TO_EDGE,CLAMP_TO_EDGE,CLAMP_TO_EDGE,NEAREST_MIPMAP_NEAREST,NEAREST,0.0
             ,true,COMPAREMODE_NONE,0,&local_1c8,false,MODE_DEPTH);
  tcu::Sampler::operator=
            ((Sampler *)(renderParams.super_RenderParams.colorBias.m_data + 2),&local_1b8);
  renderParams.super_RenderParams.bias = spec.valueMax.m_data[2];
  renderParams.super_RenderParams.ref = spec.valueMax.m_data[3];
  renderParams.super_RenderParams.colorScale.m_data[0] = spec.lookupScale.m_data[0];
  renderParams.super_RenderParams.colorScale.m_data[1] = spec.lookupScale.m_data[1];
  renderParams.super_RenderParams.colorScale.m_data[2] = spec.lookupScale.m_data[2];
  renderParams.super_RenderParams.colorScale.m_data[3] = spec.lookupScale.m_data[3];
  renderParams.super_RenderParams.colorBias.m_data[0] = spec.lookupBias.m_data[0];
  renderParams.super_RenderParams.colorBias.m_data[1] = spec.lookupBias.m_data[1];
  (**(code **)(lVar3 + 8))(0x84c0);
  (**(code **)(lVar3 + 0xb8))(0x806f,name);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"Failed to bind texture.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fCopyImageTests.cpp"
                  ,0x559);
  (**(code **)(lVar3 + 0x1360))(0x806f,0x2802,0x812f);
  (**(code **)(lVar3 + 0x1360))(0x806f,0x2803,0x812f);
  (**(code **)(lVar3 + 0x1360))(0x806f,0x8072,0x812f);
  (**(code **)(lVar3 + 0x1360))(0x806f,0x2801,0x2700);
  (**(code **)(lVar3 + 0x1360))(0x806f,0x2800,0x2600);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"Failed to setup texture filtering state.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fCopyImageTests.cpp"
                  ,0x560);
  renderTexture<tcu::Texture3DView>
            (renderContext,renderer,(ReferenceParams *)&imageIterator.m_currentImage,results,rng,
             refTexture,verify,(TextureImageIterator *)local_154,log_00);
  (**(code **)(lVar3 + 0xb8))(0x806f,0);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"Failed to unbind texture.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fCopyImageTests.cpp"
                  ,0x565);
  TextureImageIterator::~TextureImageIterator((TextureImageIterator *)local_154);
  return;
}

Assistant:

void renderTexture3DView (tcu::TestContext&			testContext,
						  glu::RenderContext&		renderContext,
						  TextureRenderer&			renderer,
						  tcu::ResultCollector&		results,
						  de::Random&				rng,
						  deUint32					name,
						  const ImageInfo&			info,
						  const tcu::Texture3DView&	refTexture,
						  Verify					verify)
{
	tcu::TestLog&					log				= testContext.getLog();
	const glw::Functions&			gl				= renderContext.getFunctions();
	const tcu::TextureFormat		format			= refTexture.getLevel(0).getFormat();
	const tcu::TextureFormatInfo	spec			= tcu::getTextureFormatInfo(format);

	ReferenceParams					renderParams	(TEXTURETYPE_3D);
	TextureImageIterator			imageIterator	(info, getLevelCount(info));

	renderParams.samplerType	= getSamplerType(format);
	renderParams.sampler		= Sampler(Sampler::CLAMP_TO_EDGE, Sampler::CLAMP_TO_EDGE, Sampler::CLAMP_TO_EDGE, Sampler::NEAREST_MIPMAP_NEAREST, Sampler::NEAREST);
	renderParams.colorScale		= spec.lookupScale;
	renderParams.colorBias		= spec.lookupBias;

	gl.activeTexture(GL_TEXTURE0);
	gl.bindTexture(GL_TEXTURE_3D, name);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to bind texture.");

	gl.texParameteri(GL_TEXTURE_3D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
	gl.texParameteri(GL_TEXTURE_3D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
	gl.texParameteri(GL_TEXTURE_3D, GL_TEXTURE_WRAP_R, GL_CLAMP_TO_EDGE);
	gl.texParameteri(GL_TEXTURE_3D, GL_TEXTURE_MIN_FILTER, GL_NEAREST_MIPMAP_NEAREST);
	gl.texParameteri(GL_TEXTURE_3D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to setup texture filtering state.");

	renderTexture<tcu::Texture3DView>(renderContext, renderer, renderParams, results, rng, refTexture, verify, imageIterator, log);

	gl.bindTexture(GL_TEXTURE_3D, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to unbind texture.");
}